

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

void __thiscall gl4cts::ShaderSubroutine::NegativeTest10::initTestCases(NegativeTest10 *this)

{
  ostream *poVar1;
  _shader_stage *shader_stage;
  int iVar2;
  NegativeTest10 *pNVar3;
  _shader_stage offending_shader_stage;
  _test_case test_case;
  stringstream name_sstream;
  int local_2ac;
  _test_cases *local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2a0;
  undefined1 local_298 [32];
  _Alloc_hider local_278;
  size_type local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  _Alloc_hider local_258;
  size_type local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  _Alloc_hider local_238;
  size_type local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  _Alloc_hider local_218;
  size_type local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  _Alloc_hider local_1f8;
  size_type local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  undefined1 local_1d8 [48];
  ostream local_1a8;
  
  local_2a0 = &local_208;
  local_2a8 = &this->m_test_cases;
  for (iVar2 = 0; iVar2 != 5; iVar2 = iVar2 + 1) {
    local_2ac = iVar2;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1d8 + 0x20));
    local_298._0_8_ = local_298 + 0x10;
    local_298._8_8_ = 0;
    local_298[0x10] = '\0';
    local_278._M_p = (pointer)&local_268;
    local_270 = 0;
    local_268._M_local_buf[0] = '\0';
    local_258._M_p = (pointer)&local_248;
    local_250 = 0;
    local_248._M_local_buf[0] = '\0';
    local_238._M_p = (pointer)&local_228;
    local_230 = 0;
    local_228._M_local_buf[0] = '\0';
    local_218._M_p = (pointer)local_2a0;
    local_210 = 0;
    local_208._M_local_buf[0] = '\0';
    local_1f8._M_p = (pointer)&local_1e8;
    local_1f0 = 0;
    local_1e8._M_local_buf[0] = '\0';
    poVar1 = std::operator<<(&local_1a8,"Broken shader stage:");
    Utils::getShaderStageString_abi_cxx11_((string *)local_1d8,(Utils *)&local_2ac,shader_stage);
    pNVar3 = (NegativeTest10 *)local_1d8;
    std::operator<<(poVar1,(string *)local_1d8);
    std::__cxx11::string::~string((string *)local_1d8);
    getFragmentShader_abi_cxx11_((string *)local_1d8,pNVar3,iVar2 == 4);
    pNVar3 = (NegativeTest10 *)local_1d8;
    std::__cxx11::string::operator=((string *)&local_278,(string *)local_1d8);
    std::__cxx11::string::~string((string *)local_1d8);
    getGeometryShader_abi_cxx11_((string *)local_1d8,pNVar3,iVar2 == 3);
    std::__cxx11::string::operator=((string *)&local_258,(string *)local_1d8);
    std::__cxx11::string::~string((string *)local_1d8);
    std::__cxx11::stringbuf::str();
    pNVar3 = (NegativeTest10 *)local_1d8;
    std::__cxx11::string::operator=((string *)local_298,(string *)local_1d8);
    std::__cxx11::string::~string((string *)local_1d8);
    getTessellationControlShader_abi_cxx11_((string *)local_1d8,pNVar3,iVar2 == 1);
    pNVar3 = (NegativeTest10 *)local_1d8;
    std::__cxx11::string::operator=((string *)&local_238,(string *)local_1d8);
    std::__cxx11::string::~string((string *)local_1d8);
    getTessellationEvaluationShader_abi_cxx11_((string *)local_1d8,pNVar3,iVar2 == 2);
    pNVar3 = (NegativeTest10 *)local_1d8;
    std::__cxx11::string::operator=((string *)&local_218,(string *)local_1d8);
    std::__cxx11::string::~string((string *)local_1d8);
    getVertexShader_abi_cxx11_((string *)local_1d8,pNVar3,iVar2 == 0);
    std::__cxx11::string::operator=((string *)&local_1f8,(string *)local_1d8);
    std::__cxx11::string::~string((string *)local_1d8);
    std::
    vector<gl4cts::ShaderSubroutine::NegativeTest10::_test_case,_std::allocator<gl4cts::ShaderSubroutine::NegativeTest10::_test_case>_>
    ::push_back(local_2a8,(_test_case *)local_298);
    _test_case::~_test_case((_test_case *)local_298);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1d8 + 0x20));
  }
  return;
}

Assistant:

void NegativeTest10::initTestCases()
{
	/* For each test case, only one shader stage should define a function that
	 * has already been defined as a subroutine. */
	for (int offending_shader_stage_it = static_cast<int>(Utils::SHADER_STAGE_FIRST);
		 offending_shader_stage_it != static_cast<int>(Utils::SHADER_STAGE_COUNT); ++offending_shader_stage_it)
	{
		Utils::_shader_stage offending_shader_stage = static_cast<Utils::_shader_stage>(offending_shader_stage_it);
		/* Form the test case descriptor */
		std::stringstream name_sstream;
		_test_case		  test_case;

		name_sstream << "Broken shader stage:" << Utils::getShaderStageString(offending_shader_stage);

		test_case.fs_body = getFragmentShader(offending_shader_stage == Utils::SHADER_STAGE_FRAGMENT);
		test_case.gs_body = getGeometryShader(offending_shader_stage == Utils::SHADER_STAGE_GEOMETRY);
		test_case.name	= name_sstream.str();
		test_case.tc_body =
			getTessellationControlShader(offending_shader_stage == Utils::SHADER_STAGE_TESSELLATION_CONTROL);
		test_case.te_body =
			getTessellationEvaluationShader(offending_shader_stage == Utils::SHADER_STAGE_TESSELLATION_EVALUATION);
		test_case.vs_body = getVertexShader(offending_shader_stage == Utils::SHADER_STAGE_VERTEX);

		m_test_cases.push_back(test_case);
	}
}